

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

void av1_pick_recursive_tx_size_type_yrd
               (AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_stats,BLOCK_SIZE bsize,int64_t ref_best_rd)

{
  MB_RD_RECORD *mb_rd_record_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  int n4_00;
  uint32_t hash_00;
  int32_t iVar4;
  int iVar5;
  int64_t iVar6;
  BLOCK_SIZE in_CL;
  MACROBLOCK *in_RDX;
  AV1_COMP *in_RSI;
  long in_RDI;
  long in_R8;
  int64_t in_stack_00000008;
  int64_t rd;
  int64_t dist;
  MB_RD_INFO *mb_rd_info;
  int match_index;
  int n4;
  int is_mb_rd_hash_enabled;
  int within_border;
  int mi_col;
  int mi_row;
  MB_RD_RECORD *mb_rd_record;
  uint32_t hash;
  TxfmSearchParams *txfm_params;
  MACROBLOCKD *xd;
  int64_t in_stack_00000138;
  BLOCK_SIZE in_stack_00000147;
  RD_STATS *in_stack_00000148;
  MACROBLOCK *in_stack_00000150;
  AV1_COMP *in_stack_00000158;
  int in_stack_0000105c;
  int64_t *in_stack_00001060;
  BLOCK_SIZE in_stack_0000106f;
  MACROBLOCK *in_stack_00001070;
  bool local_7a;
  bool local_79;
  MACROBLOCK *in_stack_ffffffffffffff88;
  MACROBLOCK *in_stack_ffffffffffffff90;
  MB_RD_RECORD *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint32_t hash_01;
  AV1_COMP *cpi_00;
  
  cpi_00 = in_RSI;
  av1_invalid_rd_stats((RD_STATS *)in_RDX);
  if (((*(int *)(in_RDI + 0x60c08) == 0) || (in_R8 == 0x7fffffffffffffff)) ||
     (iVar1 = model_based_tx_search_prune(cpi_00,in_RDX,in_CL,in_R8), iVar1 == 0)) {
    iVar1 = *(int *)(cpi_00->enc_quant_dequant_params).quants.y_quant[0x19];
    hash_01 = *(uint32_t *)((cpi_00->enc_quant_dequant_params).quants.y_quant[0x19] + 2);
    local_79 = false;
    if (((*(int *)(in_RSI->enc_quant_dequant_params).quants.y_zbin[3] <= iVar1) &&
        (local_79 = false,
        (int)(iVar1 + (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                            [in_CL]) <
        *(int *)((in_RSI->enc_quant_dequant_params).quants.y_zbin[3] + 2))) &&
       (local_79 = false,
       *(int *)((in_RSI->enc_quant_dequant_params).quants.y_zbin[3] + 4) <= (int)hash_01)) {
      local_79 = (int)(hash_01 +
                      "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                      [in_CL]) < *(int *)((in_RSI->enc_quant_dequant_params).quants.y_zbin[3] + 6);
    }
    uVar2 = (uint)local_79;
    local_7a = false;
    if (uVar2 != 0) {
      local_7a = *(int *)(in_RDI + 0x60c28) != 0;
    }
    uVar3 = (uint)local_7a;
    n4_00 = bsize_to_num_blk(in_CL);
    if (uVar3 != 0) {
      hash_00 = get_block_residue_hash
                          (in_stack_ffffffffffffff90,
                           (BLOCK_SIZE)((ulong)in_stack_ffffffffffffff88 >> 0x38));
      mb_rd_record_00 =
           *(MB_RD_RECORD **)
            ((long)((cpi_00->td).mb.coeff_costs.coeff_costs[2][1].base_cost + 0xd) + 0x10);
      iVar4 = find_mb_rd_info(mb_rd_record_00,in_R8,hash_00);
      if (iVar4 != -1) {
        fetch_mb_rd_info(n4_00,mb_rd_record_00->mb_rd_info + iVar4,
                         (RD_STATS *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        return;
      }
      in_stack_ffffffffffffffa0 = 0xffffffff;
    }
    if ((*(int *)((long)((in_RSI->td).mb.coeff_costs.coeff_costs[2][0].lps_cost + 6) + 0x3c) == 0)
       || (iVar5 = predict_skip_txfm(in_stack_00001070,in_stack_0000106f,in_stack_00001060,
                                     in_stack_0000105c), iVar5 == 0)) {
      iVar6 = select_tx_size_and_type
                        (in_stack_00000158,in_stack_00000150,in_stack_00000148,in_stack_00000147,
                         in_stack_00000138);
      if (iVar6 == 0x7fffffffffffffff) {
        av1_invalid_rd_stats((RD_STATS *)in_RDX);
      }
      else if (uVar3 != 0) {
        save_mb_rd_info(iVar1,hash_01,(MACROBLOCK *)CONCAT44(uVar2,uVar3),
                        (RD_STATS *)CONCAT44(n4_00,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff98);
      }
    }
    else {
      set_skip_txfm((MACROBLOCK *)mb_rd_info,(RD_STATS *)dist,rd._7_1_,in_stack_00000008);
      if (uVar3 != 0) {
        save_mb_rd_info(iVar1,hash_01,(MACROBLOCK *)CONCAT44(uVar2,uVar3),
                        (RD_STATS *)CONCAT44(n4_00,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff98);
      }
    }
  }
  return;
}

Assistant:

void av1_pick_recursive_tx_size_type_yrd(const AV1_COMP *cpi, MACROBLOCK *x,
                                         RD_STATS *rd_stats, BLOCK_SIZE bsize,
                                         int64_t ref_best_rd) {
  MACROBLOCKD *const xd = &x->e_mbd;
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  assert(is_inter_block(xd->mi[0]));

  av1_invalid_rd_stats(rd_stats);

  // If modeled RD cost is a lot worse than the best so far, terminate early.
  if (cpi->sf.tx_sf.model_based_prune_tx_search_level &&
      ref_best_rd != INT64_MAX) {
    if (model_based_tx_search_prune(cpi, x, bsize, ref_best_rd)) return;
  }

  // Hashing based speed feature. If the hash of the prediction residue block is
  // found in the hash table, use previous search results and terminate early.
  uint32_t hash = 0;
  MB_RD_RECORD *mb_rd_record = NULL;
  const int mi_row = x->e_mbd.mi_row;
  const int mi_col = x->e_mbd.mi_col;
  const int within_border =
      mi_row >= xd->tile.mi_row_start &&
      (mi_row + mi_size_high[bsize] < xd->tile.mi_row_end) &&
      mi_col >= xd->tile.mi_col_start &&
      (mi_col + mi_size_wide[bsize] < xd->tile.mi_col_end);
  const int is_mb_rd_hash_enabled =
      (within_border && cpi->sf.rd_sf.use_mb_rd_hash);
  const int n4 = bsize_to_num_blk(bsize);
  if (is_mb_rd_hash_enabled) {
    hash = get_block_residue_hash(x, bsize);
    mb_rd_record = x->txfm_search_info.mb_rd_record;
    const int match_index = find_mb_rd_info(mb_rd_record, ref_best_rd, hash);
    if (match_index != -1) {
      MB_RD_INFO *mb_rd_info = &mb_rd_record->mb_rd_info[match_index];
      fetch_mb_rd_info(n4, mb_rd_info, rd_stats, x);
      return;
    }
  }

  // If we predict that skip is the optimal RD decision - set the respective
  // context and terminate early.
  int64_t dist;
  if (txfm_params->skip_txfm_level &&
      predict_skip_txfm(x, bsize, &dist,
                        cpi->common.features.reduced_tx_set_used)) {
    set_skip_txfm(x, rd_stats, bsize, dist);
    // Save the RD search results into mb_rd_record.
    if (is_mb_rd_hash_enabled)
      save_mb_rd_info(n4, hash, x, rd_stats, mb_rd_record);
    return;
  }
#if CONFIG_SPEED_STATS
  ++x->txfm_search_info.tx_search_count;
#endif  // CONFIG_SPEED_STATS

  const int64_t rd =
      select_tx_size_and_type(cpi, x, rd_stats, bsize, ref_best_rd);

  if (rd == INT64_MAX) {
    // We should always find at least one candidate unless ref_best_rd is less
    // than INT64_MAX (in which case, all the calls to select_tx_size_fix_type
    // might have failed to find something better)
    assert(ref_best_rd != INT64_MAX);
    av1_invalid_rd_stats(rd_stats);
    return;
  }

  // Save the RD search results into mb_rd_record.
  if (is_mb_rd_hash_enabled) {
    assert(mb_rd_record != NULL);
    save_mb_rd_info(n4, hash, x, rd_stats, mb_rd_record);
  }
}